

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# document.h
# Opt level: O0

bool __thiscall
rapidjson::
GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
::String(GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
         *this,Ch *str,SizeType length,bool copy)

{
  undefined1 in_CL;
  undefined4 in_EDX;
  GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
  *in_RSI;
  undefined8 in_RDI;
  size_t in_stack_ffffffffffffffc8;
  Stack<rapidjson::CrtAllocator> *in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd8;
  SizeType length_00;
  undefined3 in_stack_ffffffffffffffe8;
  uint uVar1;
  undefined4 uVar2;
  
  length_00 = (SizeType)((ulong)in_RDI >> 0x20);
  uVar1 = CONCAT13(in_CL,in_stack_ffffffffffffffe8) & 0x1ffffff;
  if ((char)(uVar1 >> 0x18) == '\0') {
    internal::Stack<rapidjson::CrtAllocator>::
    Push<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>>
              (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    GenericValue(&in_RSI->
                  super_GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                 ,(Ch *)CONCAT44(in_EDX,uVar1),length_00);
  }
  else {
    internal::Stack<rapidjson::CrtAllocator>::
    Push<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>>
              (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
    uVar2 = in_EDX;
    GetAllocator(in_RSI);
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    GenericValue(&in_RSI->
                  super_GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                 ,(Ch *)CONCAT44(uVar2,uVar1),length_00,
                 (MemoryPoolAllocator<rapidjson::CrtAllocator> *)
                 CONCAT44(in_EDX,in_stack_ffffffffffffffd8));
  }
  return true;
}

Assistant:

bool String(const Ch* str, SizeType length, bool copy) { 
        if (copy) 
            new (stack_.template Push<ValueType>()) ValueType(str, length, GetAllocator());
        else
            new (stack_.template Push<ValueType>()) ValueType(str, length);
        return true;
    }